

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O0

Duration absl::time_internal::FromInt64(long v)

{
  long lVar1;
  Duration DVar2;
  Duration d;
  int64_t v_local;
  int64_t local_18;
  uint32_t local_10;
  
  lVar1 = std::numeric_limits<long>::max();
  if ((lVar1 / 0x3c < v) || (lVar1 = std::numeric_limits<long>::min(), v < lVar1 / 0x3c)) {
    if (v < 1) {
      DVar2 = InfiniteDuration();
      d._12_4_ = 0;
      d.rep_hi_ = SUB128(DVar2._0_12_,0);
      d.rep_lo_ = SUB124(DVar2._0_12_,8);
      DVar2 = absl::operator-(d);
      local_18 = DVar2.rep_hi_;
      local_10 = DVar2.rep_lo_;
    }
    else {
      DVar2 = InfiniteDuration();
      local_18 = DVar2.rep_hi_;
      local_10 = DVar2.rep_lo_;
    }
  }
  else {
    DVar2 = MakeDuration(v * 0x3c,0);
    local_18 = DVar2.rep_hi_;
    local_10 = DVar2.rep_lo_;
  }
  DVar2.rep_lo_ = local_10;
  DVar2.rep_hi_ = local_18;
  DVar2._12_4_ = 0;
  return DVar2;
}

Assistant:

constexpr Duration FromInt64(int64_t v, std::ratio<60>) {
  return (v <= (std::numeric_limits<int64_t>::max)() / 60 &&
          v >= (std::numeric_limits<int64_t>::min)() / 60)
             ? MakeDuration(v * 60)
             : v > 0 ? InfiniteDuration() : -InfiniteDuration();
}